

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void pmu_init_arm(ARMCPU *cpu)

{
  ushort uVar1;
  _Bool _Var2;
  ulong uVar3;
  _func__Bool_CPUARMState_ptr **pp_Var4;
  long lVar5;
  
  supported_event_map[0x38] = 0xffff;
  supported_event_map[0x39] = 0xffff;
  supported_event_map[0x3a] = 0xffff;
  supported_event_map[0x3b] = 0xffff;
  supported_event_map[0x3c] = 0xffff;
  supported_event_map[0x30] = 0xffff;
  supported_event_map[0x31] = 0xffff;
  supported_event_map[0x32] = 0xffff;
  supported_event_map[0x33] = 0xffff;
  supported_event_map[0x34] = 0xffff;
  supported_event_map[0x35] = 0xffff;
  supported_event_map[0x36] = 0xffff;
  supported_event_map[0x37] = 0xffff;
  supported_event_map[0x28] = 0xffff;
  supported_event_map[0x29] = 0xffff;
  supported_event_map[0x2a] = 0xffff;
  supported_event_map[0x2b] = 0xffff;
  supported_event_map[0x2c] = 0xffff;
  supported_event_map[0x2d] = 0xffff;
  supported_event_map[0x2e] = 0xffff;
  supported_event_map[0x2f] = 0xffff;
  supported_event_map[0x20] = 0xffff;
  supported_event_map[0x21] = 0xffff;
  supported_event_map[0x22] = 0xffff;
  supported_event_map[0x23] = 0xffff;
  supported_event_map[0x24] = 0xffff;
  supported_event_map[0x25] = 0xffff;
  supported_event_map[0x26] = 0xffff;
  supported_event_map[0x27] = 0xffff;
  supported_event_map[0x18] = 0xffff;
  supported_event_map[0x19] = 0xffff;
  supported_event_map[0x1a] = 0xffff;
  supported_event_map[0x1b] = 0xffff;
  supported_event_map[0x1c] = 0xffff;
  supported_event_map[0x1d] = 0xffff;
  supported_event_map[0x1e] = 0xffff;
  supported_event_map[0x1f] = 0xffff;
  supported_event_map[0x10] = 0xffff;
  supported_event_map[0x11] = 0xffff;
  supported_event_map[0x12] = 0xffff;
  supported_event_map[0x13] = 0xffff;
  supported_event_map[0x14] = 0xffff;
  supported_event_map[0x15] = 0xffff;
  supported_event_map[0x16] = 0xffff;
  supported_event_map[0x17] = 0xffff;
  supported_event_map[8] = 0xffff;
  supported_event_map[9] = 0xffff;
  supported_event_map[10] = 0xffff;
  supported_event_map[0xb] = 0xffff;
  supported_event_map[0xc] = 0xffff;
  supported_event_map[0xd] = 0xffff;
  supported_event_map[0xe] = 0xffff;
  supported_event_map[0xf] = 0xffff;
  supported_event_map[0] = 0xffff;
  supported_event_map[1] = 0xffff;
  supported_event_map[2] = 0xffff;
  supported_event_map[3] = 0xffff;
  supported_event_map[4] = 0xffff;
  supported_event_map[5] = 0xffff;
  supported_event_map[6] = 0xffff;
  supported_event_map[7] = 0xffff;
  cpu->pmceid0 = 0;
  cpu->pmceid1 = 0;
  pp_Var4 = &pm_events[0].supported;
  lVar5 = 0;
  do {
    uVar1 = ((pm_event *)(pp_Var4 + -1))->number;
    if (0x3c < (ulong)uVar1) {
      __assert_fail("cnt->number <= MAX_EVENT_ID",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                    ,0x3aa,"void pmu_init_arm(ARMCPU *)");
    }
    _Var2 = (**pp_Var4)(&cpu->env);
    if (_Var2) {
      supported_event_map[uVar1] = (uint16_t)lVar5;
      uVar3 = 1L << ((byte)uVar1 & 0x1f);
      if (uVar1 < 0x20) {
        cpu->pmceid0 = cpu->pmceid0 | uVar3;
      }
      else {
        cpu->pmceid1 = cpu->pmceid1 | uVar3;
      }
    }
    lVar5 = lVar5 + 1;
    pp_Var4 = pp_Var4 + 4;
  } while (lVar5 != 6);
  return;
}

Assistant:

void pmu_init(ARMCPU *cpu)
{
    unsigned int i;

    /*
     * Empty supported_event_map and cpu->pmceid[01] before adding supported
     * events to them
     */
    for (i = 0; i < ARRAY_SIZE(supported_event_map); i++) {
        supported_event_map[i] = UNSUPPORTED_EVENT;
    }
    cpu->pmceid0 = 0;
    cpu->pmceid1 = 0;

    for (i = 0; i < ARRAY_SIZE(pm_events); i++) {
        const pm_event *cnt = &pm_events[i];
        assert(cnt->number <= MAX_EVENT_ID);
        /* We do not currently support events in the 0x40xx range */
        assert(cnt->number <= 0x3f);

        if (cnt->supported(&cpu->env)) {
            supported_event_map[cnt->number] = i;
            uint64_t event_mask = 1ULL << (cnt->number & 0x1f);
            if (cnt->number & 0x20) {
                cpu->pmceid1 |= event_mask;
            } else {
                cpu->pmceid0 |= event_mask;
            }
        }
    }
}